

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::PushLiteral(ParseState *this,Rune r)

{
  bool bVar1;
  ParseFlags PVar2;
  Rune RVar3;
  ParseFlags b;
  void *pvVar4;
  void *pvVar5;
  Regexp *this_00;
  int in_ESI;
  ParseFlags *in_RDI;
  Regexp *re;
  Rune r1;
  Regexp *re_1;
  Rune in_stack_000000a0;
  Rune in_stack_000000a4;
  CharClassBuilder *in_stack_000000a8;
  ParseFlags in_stack_ffffffffffffff88;
  RegexpOp in_stack_ffffffffffffff8c;
  CharClassBuilder *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Regexp *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_14;
  bool local_1;
  
  PVar2 = operator&(*in_RDI,FoldCase);
  if ((PVar2 != NoParseFlags) &&
     (RVar3 = CycleFoldRune((Rune)in_stack_ffffffffffffff90), RVar3 != in_ESI)) {
    pvVar4 = operator_new(0x28);
    PVar2 = *in_RDI;
    b = operator~(FoldCase);
    operator&(PVar2,b);
    Regexp((Regexp *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    pvVar5 = operator_new(0x40);
    CharClassBuilder::CharClassBuilder(in_stack_ffffffffffffff90);
    *(void **)((long)pvVar4 + 0x20) = pvVar5;
    local_14 = in_ESI;
    do {
      PVar2 = operator&(*in_RDI,NeverNL);
      if ((PVar2 == NoParseFlags) || (local_14 != 10)) {
        CharClassBuilder::AddRange(in_stack_000000a8,in_stack_000000a4,in_stack_000000a0);
      }
      local_14 = CycleFoldRune((Rune)in_stack_ffffffffffffff90);
    } while (local_14 != in_ESI);
    bVar1 = PushRegexp((ParseState *)CONCAT44(in_stack_ffffffffffffffd4,in_ESI),
                       in_stack_ffffffffffffffc8);
    return bVar1;
  }
  PVar2 = operator&(*in_RDI,NeverNL);
  if ((PVar2 == NoParseFlags) || (in_ESI != 10)) {
    bVar1 = MaybeConcatString((ParseState *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                              (ParseFlags)in_stack_ffffffffffffffb0);
    if (bVar1) {
      local_1 = true;
    }
    else {
      this_00 = (Regexp *)operator_new(0x28);
      Regexp(this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      (this_00->field_7).field_0.max_ = in_ESI;
      local_1 = PushRegexp((ParseState *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),this_00);
    }
  }
  else {
    operator_new(0x28);
    Regexp((Regexp *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    local_1 = PushRegexp((ParseState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,in_stack_ffffffffffffffc8);
  }
  return local_1;
}

Assistant:

bool Regexp::ParseState::PushLiteral(Rune r) {
  // Do case folding if needed.
  if ((flags_ & FoldCase) && CycleFoldRune(r) != r) {
    Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
    re->ccb_ = new CharClassBuilder;
    Rune r1 = r;
    do {
      if (!(flags_ & NeverNL) || r != '\n') {
        re->ccb_->AddRange(r, r);
      }
      r = CycleFoldRune(r);
    } while (r != r1);
    return PushRegexp(re);
  }

  // Exclude newline if applicable.
  if ((flags_ & NeverNL) && r == '\n')
    return PushRegexp(new Regexp(kRegexpNoMatch, flags_));

  // No fancy stuff worked.  Ordinary literal.
  if (MaybeConcatString(r, flags_))
    return true;

  Regexp* re = new Regexp(kRegexpLiteral, flags_);
  re->rune_ = r;
  return PushRegexp(re);
}